

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_waveops.cpp
# Opt level: O0

Id dxil_spv::build_mask_reduction_input_arith
             (Impl *impl,CallInst *instruction,Id input_value,WaveOpKind op_kind)

{
  CallInst *pCVar1;
  bool bVar2;
  unsigned_short uVar3;
  Id IVar4;
  TypeID TVar5;
  uint uVar6;
  Builder *this;
  Type *pTVar7;
  unsigned_long_long uVar8;
  unsigned_long uVar9;
  Value *pVVar10;
  Operation *pOVar11;
  float fVar12;
  double dVar13;
  Operation *replace_op;
  Id replacement_value;
  uint32_t sign_kind;
  Operation *is_helper_lane;
  Builder *builder;
  WaveOpKind op_kind_local;
  CallInst *pCStack_20;
  Id input_value_local;
  CallInst *instruction_local;
  Impl *impl_local;
  
  builder._3_1_ = op_kind;
  builder._4_4_ = input_value;
  pCStack_20 = instruction;
  instruction_local = (CallInst *)impl;
  is_helper_lane = (Operation *)Converter::Impl::builder(impl);
  pCVar1 = instruction_local;
  this = Converter::Impl::builder((Impl *)instruction_local);
  IVar4 = spv::Builder::makeBoolType(this);
  _replacement_value = Converter::Impl::allocate((Impl *)pCVar1,OpIsHelperInvocationEXT,IVar4);
  Converter::Impl::add((Impl *)instruction_local,_replacement_value,false);
  bVar2 = get_constant_operand(&pCStack_20->super_Instruction,3,(uint32_t *)((long)&replace_op + 4))
  ;
  if (!bVar2) {
    return 0;
  }
  pTVar7 = LLVMBC::Value::getType((Value *)pCStack_20);
  TVar5 = LLVMBC::Type::getTypeID(pTVar7);
  pOVar11 = is_helper_lane;
  if (TVar5 == FloatTyID) {
    switch(builder._3_1_) {
    case Sum:
      replace_op._0_4_ = spv::Builder::makeFloatConstant((Builder *)is_helper_lane,0.0,false);
      break;
    case Product:
      replace_op._0_4_ = spv::Builder::makeFloatConstant((Builder *)is_helper_lane,1.0,false);
      break;
    case Min:
      fVar12 = std::numeric_limits<float>::infinity();
      replace_op._0_4_ = spv::Builder::makeFloatConstant((Builder *)pOVar11,fVar12,false);
      break;
    case Max:
      fVar12 = std::numeric_limits<float>::infinity();
      replace_op._0_4_ = spv::Builder::makeFloatConstant((Builder *)pOVar11,-fVar12,false);
    }
  }
  else {
    pTVar7 = LLVMBC::Value::getType((Value *)pCStack_20);
    TVar5 = LLVMBC::Type::getTypeID(pTVar7);
    pOVar11 = is_helper_lane;
    if (TVar5 == DoubleTyID) {
      switch(builder._3_1_) {
      case Sum:
        replace_op._0_4_ = spv::Builder::makeDoubleConstant((Builder *)is_helper_lane,0.0,false);
        break;
      case Product:
        replace_op._0_4_ = spv::Builder::makeDoubleConstant((Builder *)is_helper_lane,1.0,false);
        break;
      case Min:
        dVar13 = std::numeric_limits<double>::infinity();
        replace_op._0_4_ = spv::Builder::makeDoubleConstant((Builder *)pOVar11,dVar13,false);
        break;
      case Max:
        dVar13 = std::numeric_limits<double>::infinity();
        replace_op._0_4_ = spv::Builder::makeDoubleConstant((Builder *)pOVar11,-dVar13,false);
      }
    }
    else {
      pTVar7 = LLVMBC::Value::getType((Value *)pCStack_20);
      TVar5 = LLVMBC::Type::getTypeID(pTVar7);
      if (TVar5 == HalfTyID) {
        switch(builder._3_1_) {
        case Sum:
          replace_op._0_4_ = spv::Builder::makeFloat16Constant((Builder *)is_helper_lane,0,false);
          break;
        case Product:
          replace_op._0_4_ =
               spv::Builder::makeFloat16Constant((Builder *)is_helper_lane,0x3c00,false);
          break;
        case Min:
          replace_op._0_4_ =
               spv::Builder::makeFloat16Constant((Builder *)is_helper_lane,0x7c00,false);
          break;
        case Max:
          replace_op._0_4_ =
               spv::Builder::makeFloat16Constant((Builder *)is_helper_lane,0xfc00,false);
        }
      }
      else if (replace_op._4_1_ == '\0') {
        pVVar10 = LLVMBC::Instruction::getOperand(&pCStack_20->super_Instruction,1);
        pTVar7 = LLVMBC::Value::getType(pVVar10);
        uVar6 = LLVMBC::Type::getIntegerBitWidth(pTVar7);
        pOVar11 = is_helper_lane;
        if (uVar6 == 0x10) {
          switch(builder._3_1_) {
          case Sum:
            replace_op._0_4_ = spv::Builder::makeUint16Constant((Builder *)is_helper_lane,0,false);
            break;
          case Product:
            replace_op._0_4_ = spv::Builder::makeUint16Constant((Builder *)is_helper_lane,1,false);
            break;
          case Min:
            uVar3 = std::numeric_limits<short>::max();
            replace_op._0_4_ = spv::Builder::makeUint16Constant((Builder *)pOVar11,uVar3,false);
            break;
          case Max:
            uVar3 = std::numeric_limits<short>::min();
            replace_op._0_4_ = spv::Builder::makeUint16Constant((Builder *)pOVar11,uVar3,false);
          }
        }
        else if (uVar6 == 0x20) {
          switch(builder._3_1_) {
          case Sum:
            replace_op._0_4_ = spv::Builder::makeUintConstant((Builder *)is_helper_lane,0,false);
            break;
          case Product:
            replace_op._0_4_ = spv::Builder::makeUintConstant((Builder *)is_helper_lane,1,false);
            break;
          case Min:
            uVar6 = std::numeric_limits<int>::max();
            replace_op._0_4_ = spv::Builder::makeUintConstant((Builder *)pOVar11,uVar6,false);
            break;
          case Max:
            uVar6 = std::numeric_limits<int>::min();
            replace_op._0_4_ = spv::Builder::makeUintConstant((Builder *)pOVar11,uVar6,false);
          }
        }
        else {
          if (uVar6 != 0x40) {
            return 0;
          }
          switch(builder._3_1_) {
          case Sum:
            replace_op._0_4_ = spv::Builder::makeUint64Constant((Builder *)is_helper_lane,0,false);
            break;
          case Product:
            replace_op._0_4_ = spv::Builder::makeUint64Constant((Builder *)is_helper_lane,1,false);
            break;
          case Min:
            uVar8 = std::numeric_limits<long>::max();
            replace_op._0_4_ = spv::Builder::makeUint64Constant((Builder *)pOVar11,uVar8,false);
            break;
          case Max:
            uVar8 = std::numeric_limits<long>::min();
            replace_op._0_4_ = spv::Builder::makeUint64Constant((Builder *)pOVar11,uVar8,false);
          }
        }
      }
      else {
        pVVar10 = LLVMBC::Instruction::getOperand(&pCStack_20->super_Instruction,1);
        pTVar7 = LLVMBC::Value::getType(pVVar10);
        uVar6 = LLVMBC::Type::getIntegerBitWidth(pTVar7);
        pOVar11 = is_helper_lane;
        if (uVar6 == 0x10) {
          switch(builder._3_1_) {
          case Sum:
            replace_op._0_4_ = spv::Builder::makeUint16Constant((Builder *)is_helper_lane,0,false);
            break;
          case Product:
            replace_op._0_4_ = spv::Builder::makeUint16Constant((Builder *)is_helper_lane,1,false);
            break;
          case Min:
            uVar3 = std::numeric_limits<unsigned_short>::max();
            replace_op._0_4_ = spv::Builder::makeUint16Constant((Builder *)pOVar11,uVar3,false);
            break;
          case Max:
            uVar3 = std::numeric_limits<unsigned_short>::min();
            replace_op._0_4_ = spv::Builder::makeUint16Constant((Builder *)pOVar11,uVar3,false);
          }
        }
        else if (uVar6 == 0x20) {
          switch(builder._3_1_) {
          case Sum:
            replace_op._0_4_ = spv::Builder::makeUintConstant((Builder *)is_helper_lane,0,false);
            break;
          case Product:
            replace_op._0_4_ = spv::Builder::makeUintConstant((Builder *)is_helper_lane,1,false);
            break;
          case Min:
            uVar6 = std::numeric_limits<unsigned_int>::max();
            replace_op._0_4_ = spv::Builder::makeUintConstant((Builder *)pOVar11,uVar6,false);
            break;
          case Max:
            uVar6 = std::numeric_limits<unsigned_int>::min();
            replace_op._0_4_ = spv::Builder::makeUintConstant((Builder *)pOVar11,uVar6,false);
          }
        }
        else {
          if (uVar6 != 0x40) {
            return 0;
          }
          switch(builder._3_1_) {
          case Sum:
            replace_op._0_4_ = spv::Builder::makeUint64Constant((Builder *)is_helper_lane,0,false);
            break;
          case Product:
            replace_op._0_4_ = spv::Builder::makeUint64Constant((Builder *)is_helper_lane,1,false);
            break;
          case Min:
            uVar9 = std::numeric_limits<unsigned_long>::max();
            replace_op._0_4_ = spv::Builder::makeUint64Constant((Builder *)pOVar11,uVar9,false);
            break;
          case Max:
            uVar9 = std::numeric_limits<unsigned_long>::min();
            replace_op._0_4_ = spv::Builder::makeUint64Constant((Builder *)pOVar11,uVar9,false);
          }
        }
      }
    }
  }
  pCVar1 = instruction_local;
  pVVar10 = LLVMBC::Instruction::getOperand(&pCStack_20->super_Instruction,1);
  pTVar7 = LLVMBC::Value::getType(pVVar10);
  IVar4 = Converter::Impl::get_type_id((Impl *)pCVar1,pTVar7,0);
  pOVar11 = Converter::Impl::allocate((Impl *)pCVar1,OpSelect,IVar4);
  Operation::add_id(pOVar11,_replacement_value->id);
  Operation::add_id(pOVar11,(Id)replace_op);
  Operation::add_id(pOVar11,builder._4_4_);
  Converter::Impl::add((Impl *)instruction_local,pOVar11,false);
  return pOVar11->id;
}

Assistant:

static spv::Id build_mask_reduction_input_arith(Converter::Impl &impl, const llvm::CallInst *instruction,
                                                spv::Id input_value, DXIL::WaveOpKind op_kind)
{
	auto &builder = impl.builder();

	// For arithmetic cases, we can just replace the input with a sentinel value
	// if we're a helper lane.
	auto *is_helper_lane = impl.allocate(spv::OpIsHelperInvocationEXT, impl.builder().makeBoolType());
	impl.add(is_helper_lane);

	uint32_t sign_kind;
	if (!get_constant_operand(instruction, 3, &sign_kind))
		return 0;

#define DECLARE_TYPE_TEMPLATE(type, product, sum, min, max) do { \
	switch (op_kind) \
	{ \
	case DXIL::WaveOpKind::Product: \
		replacement_value = builder.make##type##Constant(product); \
		break; \
	case DXIL::WaveOpKind::Sum: \
		replacement_value = builder.make##type##Constant(sum); \
		break; \
	case DXIL::WaveOpKind::Min: \
		replacement_value = builder.make##type##Constant(min); \
		break; \
	case DXIL::WaveOpKind::Max: \
		replacement_value = builder.make##type##Constant(max); \
		break; \
	} \
} while(0)

	spv::Id replacement_value;
	if (instruction->getType()->getTypeID() == llvm::Type::TypeID::FloatTyID)
	{
		DECLARE_TYPE_TEMPLATE(Float,
		                      1.0f, 0.0f,
		                      std::numeric_limits<float>::infinity(),
		                      -std::numeric_limits<float>::infinity());
	}
	else if (instruction->getType()->getTypeID() == llvm::Type::TypeID::DoubleTyID)
	{
		DECLARE_TYPE_TEMPLATE(Double,
		                      1.0, 0.0,
		                      std::numeric_limits<double>::infinity(),
		                      -std::numeric_limits<double>::infinity());
	}
	else if (instruction->getType()->getTypeID() == llvm::Type::TypeID::HalfTyID)
	{
		DECLARE_TYPE_TEMPLATE(Float16, 0x3c00, 0, 0x7c00, 0xfc00);
	}
	else if (static_cast<DXIL::SignedOpKind>(sign_kind) == DXIL::SignedOpKind::Signed)
	{
		switch (instruction->getOperand(1)->getType()->getIntegerBitWidth())
		{
		case 16:
			DECLARE_TYPE_TEMPLATE(Uint16, 1, 0,
			                      uint16_t(std::numeric_limits<int16_t>::max()),
			                      uint16_t(std::numeric_limits<int16_t>::min()));
			break;

		case 32:
			DECLARE_TYPE_TEMPLATE(Uint, 1, 0,
			                      uint32_t(std::numeric_limits<int32_t>::max()),
			                      uint32_t(std::numeric_limits<int32_t>::min()));
			break;

		case 64:
			DECLARE_TYPE_TEMPLATE(Uint64, 1, 0,
			                      uint64_t(std::numeric_limits<int64_t>::max()),
			                      uint64_t(std::numeric_limits<int64_t>::min()));
			break;

		default:
			return 0;
		}
	}
	else
	{
		switch (instruction->getOperand(1)->getType()->getIntegerBitWidth())
		{
		case 16:
			DECLARE_TYPE_TEMPLATE(Uint16, 1, 0,
			                      std::numeric_limits<uint16_t>::max(),
			                      std::numeric_limits<uint16_t>::min());
			break;

		case 32:
			DECLARE_TYPE_TEMPLATE(Uint, 1, 0,
			                      std::numeric_limits<uint32_t>::max(),
			                      std::numeric_limits<uint32_t>::min());
			break;

		case 64:
			DECLARE_TYPE_TEMPLATE(Uint64, 1, 0,
			                      std::numeric_limits<uint64_t>::max(),
			                      std::numeric_limits<uint64_t>::min());
			break;

		default:
			return 0;
		}
	}

	auto *replace_op = impl.allocate(spv::OpSelect, impl.get_type_id(instruction->getOperand(1)->getType()));
	replace_op->add_id(is_helper_lane->id);
	replace_op->add_id(replacement_value);
	replace_op->add_id(input_value);
	impl.add(replace_op);
	return replace_op->id;
}